

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O0

void __thiscall google::protobuf::FileDescriptorSet::~FileDescriptorSet(FileDescriptorSet *this)

{
  FileDescriptorSet *this_local;
  
  SharedDtor((MessageLite *)this);
  Message::~Message(&this->super_Message);
  return;
}

Assistant:

FileDescriptorSet::~FileDescriptorSet() {
  // @@protoc_insertion_point(destructor:google.protobuf.FileDescriptorSet)
  SharedDtor(*this);
}